

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere.cpp
# Opt level: O2

double __thiscall phyr::Sphere::pdf(Sphere *this,Interaction *ref,Vector3f *wi)

{
  double dVar1;
  double dVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  Point3f pOrigin;
  Point3f pCenter;
  Point3<double> local_88;
  Point3<double> local_68;
  Vector3f local_48;
  
  local_88.x = 0.0;
  local_88.y = 0.0;
  local_88.z = 0.0;
  Transform::operator()((this->super_Shape).localToWorld,&local_88);
  local_48.z = local_68.z - (ref->p).z;
  local_48.x = local_68.x - (ref->p).x;
  local_48.y = local_68.y - (ref->p).y;
  offsetRayOrigin(&local_88,&ref->p,&ref->n,&local_48,&ref->pfError);
  dVar1 = this->radius * this->radius;
  if ((local_88.z - local_68.z) * (local_88.z - local_68.z) +
      (local_88.x - local_68.x) * (local_88.x - local_68.x) +
      (local_88.y - local_68.y) * (local_88.y - local_68.y) <= dVar1) {
    dVar1 = Shape::pdf(&this->super_Shape,ref,wi);
    uVar3 = SUB84(dVar1,0);
    uVar4 = (undefined4)((ulong)dVar1 >> 0x20);
  }
  else {
    dVar2 = distanceSquared<double>(&ref->p,&local_68);
    dVar1 = 1.0 - dVar1 / dVar2;
    if (dVar1 <= 0.0) {
      dVar1 = 0.0;
    }
    dVar1 = uniformConePdf(SQRT(dVar1));
    uVar3 = SUB84(dVar1,0);
    uVar4 = (undefined4)((ulong)dVar1 >> 0x20);
  }
  return (double)CONCAT44(uVar4,uVar3);
}

Assistant:

Real Sphere::pdf(const Interaction& ref, const Vector3f& wi) const {
    Point3f pCenter = (*localToWorld)(Point3f(0, 0, 0));
    // Return uniform PDF if point is inside sphere
    Point3f pOrigin =
        offsetRayOrigin(ref.p, ref.n, pCenter - ref.p, ref.pfError);
    if (distanceSquared(pOrigin, pCenter) <= radius * radius)
        return Shape::pdf(ref, wi);

    // Compute general sphere PDF
    Real sinThetaMax2 = radius * radius / distanceSquared(ref.p, pCenter);
    Real cosThetaMax = std::sqrt(std::max((Real)0, 1 - sinThetaMax2));
    return uniformConePdf(cosThetaMax);
}